

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglcompositorbackingstore.cpp
# Opt level: O1

void __thiscall
QOpenGLCompositorBackingStore::resize
          (QOpenGLCompositorBackingStore *this,QSize *size,QRegion *staticContents)

{
  QSurface *pQVar1;
  undefined8 uVar2;
  QOpenGLCompositor *pQVar3;
  long in_FS_OFFSET;
  QImage local_60 [16];
  undefined8 local_50;
  code *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QOpenGLCompositor::instance();
  pQVar1 = (QSurface *)pQVar3->m_context;
  if ((pQVar1 != (QSurface *)0x0) && (pQVar3->m_targetWindow != (QWindow *)0x0)) {
    QImage::QImage(local_60,size,Format_RGBA8888);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (code *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_48);
    uVar2 = local_50;
    local_48 = QTextStream::operator<<;
    local_50 = 0;
    local_38 = *(undefined1 **)&this->field_0x28;
    *(undefined8 *)&this->field_0x28 = uVar2;
    QImage::~QImage((QImage *)&local_48);
    QImage::~QImage(local_60);
    QWindow::create();
    QOpenGLContext::makeCurrent(pQVar1);
    if (this->m_bsTexture != 0) {
      if (this->m_bsTextureWrapper != (QRhiTexture *)0x0) {
        (**(code **)(*(long *)this->m_bsTextureWrapper + 8))();
      }
      this->m_bsTextureWrapper = (QRhiTexture *)0x0;
      glDeleteTextures(1,&this->m_bsTexture);
      this->m_bsTexture = 0;
      this->m_bsTextureContext = (QOpenGLContext *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLCompositorBackingStore::resize(const QSize &size, const QRegion &staticContents)
{
    Q_UNUSED(staticContents);

    QOpenGLCompositor *compositor = QOpenGLCompositor::instance();
    QOpenGLContext *dstCtx = compositor->context();
    if (!dstCtx)
        return;
    QWindow *dstWin = compositor->targetWindow();
    if (!dstWin)
        return;

    m_image = QImage(size, QImage::Format_RGBA8888);

    m_window->create();

    dstCtx->makeCurrent(dstWin);
    if (m_bsTexture) {
        delete m_bsTextureWrapper;
        m_bsTextureWrapper = nullptr;
        glDeleteTextures(1, &m_bsTexture);
        m_bsTexture = 0;
        m_bsTextureContext = nullptr;
    }
}